

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

bool __thiscall
Inline::TryOptimizeCallInstrWithFixedMethod
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlineeInfo,bool isPolymorphic,
          bool isBuiltIn,bool isCtor,bool isInlined,bool *safeThis,bool dontOptimizeJustCheck,uint i
          )

{
  OpCode OVar1;
  uint uVar2;
  InlineCacheIndex IVar3;
  ThreadContextInfo *pTVar4;
  Func *this_00;
  code *pcVar5;
  bool bVar6;
  bool bVar7;
  ValueType valueType;
  uint uVar8;
  uint uVar9;
  PropertyId PVar10;
  TypeId TVar11;
  JITTimeFunctionBody *pJVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  intptr_t iVar15;
  undefined4 *puVar16;
  RegOpnd *pRVar17;
  StackSym *pSVar18;
  PropertySymOpnd *this_01;
  char16 *pcVar19;
  FixedFieldInfo *this_02;
  intptr_t iVar20;
  PropertyRecord *pPVar21;
  Opnd *dstOpnd;
  Instr *pIVar22;
  BailOutInfo *pBVar23;
  SymOpnd *this_03;
  PropertySymOpnd *this_04;
  JITTimeConstructorCache *this_05;
  ProfiledInstr *pPVar24;
  AddrOpnd *src1Opnd;
  Instr *instr;
  char16_t *pcVar25;
  Phase PVar26;
  char16_t *pcVar27;
  ThreadContext *pTVar28;
  char16_t *pcVar29;
  char16 *calleeName;
  char16_t *pcVar30;
  wchar local_138 [4];
  char16 debugStringBuffer2 [42];
  wchar local_d8 [4];
  char16 debugStringBuffer [42];
  char16_t *local_58;
  char16_t *local_48;
  char16_t *local_38;
  
  uVar8 = Func::GetSourceContextId(callInstr->m_func);
  uVar9 = Func::GetLocalFunctionId(callInstr->m_func);
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,FixedMethodsPhase,uVar8,uVar9);
  if (bVar6) {
    return false;
  }
  uVar8 = Func::GetSourceContextId(callInstr->m_func);
  uVar9 = Func::GetLocalFunctionId(callInstr->m_func);
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,FixedMethodsPhase,uVar8,uVar9);
  if (bVar6) {
LAB_00501173:
    if (dontOptimizeJustCheck) {
LAB_00501275:
      bVar6 = false;
      goto LAB_005012f2;
    }
  }
  else {
    uVar8 = Func::GetSourceContextId(callInstr->m_func);
    uVar9 = Func::GetLocalFunctionId(callInstr->m_func);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,FixedMethodsPhase,uVar8,uVar9);
    if (bVar6) goto LAB_00501173;
    if (!isCtor) goto LAB_00501275;
    uVar8 = Func::GetSourceContextId(callInstr->m_func);
    uVar9 = Func::GetLocalFunctionId(callInstr->m_func);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,FixedNewObjPhase,uVar8,uVar9);
    if (bVar6) goto LAB_00501173;
    uVar8 = Func::GetSourceContextId(callInstr->m_func);
    uVar9 = Func::GetLocalFunctionId(callInstr->m_func);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,FixedNewObjPhase,uVar8,uVar9);
    if (!bVar6 || dontOptimizeJustCheck) goto LAB_00501275;
  }
  local_38 = L"<unknown>";
  bVar6 = true;
  if (((inlineeInfo != (FunctionJITTimeInfo *)0x0) &&
      (bVar7 = FunctionJITTimeInfo::HasBody(inlineeInfo), bVar7)) &&
     (pJVar12 = FunctionJITTimeInfo::GetBody(inlineeInfo), pJVar12 != (JITTimeFunctionBody *)0x0)) {
    local_38 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    bVar6 = false;
  }
  pJVar12 = Func::GetJITFunctionBody(callInstr->m_func);
  pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
  pcVar14 = Func::GetDebugNumberSet(callInstr->m_func,(wchar (*) [42])local_d8);
  if (bVar6) {
    pcVar19 = L"(null)";
  }
  else {
    pcVar19 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeInfo,(wchar (*) [42])local_138);
  }
  if (inlineeInfo == (FunctionJITTimeInfo *)0x0) {
    iVar15 = 0;
  }
  else {
    iVar15 = FunctionJITTimeInfo::GetFunctionInfoAddr(inlineeInfo);
  }
  Output::Print(L"FixedFields: function %s (%s): considering method (%s %s): polymorphic = %d, built-in = %d, ctor = %d, inlined = %d, functionInfo = %p.\n"
                ,pcVar13,pcVar14,local_38,pcVar19,isPolymorphic,(ulong)isBuiltIn,(ulong)isCtor,
                (ulong)isInlined,iVar15);
  Output::Flush();
  bVar6 = true;
LAB_005012f2:
  if ((isPolymorphic && !dontOptimizeJustCheck) && isInlined) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar16 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x633,"(dontOptimizeJustCheck)","dontOptimizeJustCheck");
    if (!bVar7) {
LAB_00502044:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar16 = 0;
  }
  pRVar17 = IR::Opnd::AsRegOpnd(callInstr->m_src1);
  pSVar18 = Sym::AsStackSym(&pRVar17->m_sym->super_Sym);
  pIVar22 = (pSVar18->field_5).m_instrDef;
  if ((pIVar22 != (Instr *)0x0 & pSVar18->field_0x18) == 1) {
    do {
      OVar1 = pIVar22->m_opcode;
      if (OVar1 != BytecodeArgOutCapture) {
        if (((0x27 < OVar1 - 0x5e) || ((0x8000015401U >> ((ulong)(OVar1 - 0x5e) & 0x3f) & 1) == 0))
           && (OVar1 != LdMethodFromFlags)) {
          if (!bVar6) {
            return false;
          }
          pcVar30 = L"<unknown>";
          bVar6 = true;
          if (inlineeInfo == (FunctionJITTimeInfo *)0x0) {
            pcVar29 = L"calling";
          }
          else {
            bVar7 = FunctionJITTimeInfo::HasBody(inlineeInfo);
            pcVar29 = L"inlining";
            if ((bVar7) &&
               (pJVar12 = FunctionJITTimeInfo::GetBody(inlineeInfo),
               pJVar12 != (JITTimeFunctionBody *)0x0)) {
              pcVar30 = JITTimeFunctionBody::GetDisplayName(pJVar12);
              bVar6 = false;
            }
          }
          pJVar12 = Func::GetJITFunctionBody(callInstr->m_func);
          pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
          pcVar14 = Func::GetDebugNumberSet(callInstr->m_func,(wchar (*) [42])local_d8);
          if (bVar6) {
            pcVar19 = L"(null)";
          }
          else {
            pcVar19 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeInfo,(wchar (*) [42])local_138);
          }
          pcVar27 = 
          L"FixedFields: function %s (%s): %s non-fixed method (%s %s), because callee does not come from LdMethodFld.\n"
          ;
          goto LAB_00501549;
        }
        this_01 = IR::Opnd::AsPropertySymOpnd(pIVar22->m_src1);
        uVar8 = Func::GetSourceContextId(callInstr->m_func);
        uVar9 = Func::GetLocalFunctionId(callInstr->m_func);
        if (isCtor) {
          if (isInlined) {
            PVar26 = FixedCtorInliningPhase;
          }
          else {
            PVar26 = FixedCtorCallsPhase;
          }
          bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,PVar26,uVar8,uVar9);
          if (!bVar7) {
            bVar7 = IR::PropertySymOpnd::UsesAccessor(this_01);
            goto joined_r0x005016bc;
          }
LAB_005016c2:
          if (!bVar6) {
            return false;
          }
          pcVar30 = L"<unknown>";
          bVar6 = true;
          if (inlineeInfo == (FunctionJITTimeInfo *)0x0) {
            local_58 = L"calling";
          }
          else {
            bVar7 = FunctionJITTimeInfo::HasBody(inlineeInfo);
            local_58 = L"inlining";
            if ((bVar7) &&
               (pJVar12 = FunctionJITTimeInfo::GetBody(inlineeInfo),
               pJVar12 != (JITTimeFunctionBody *)0x0)) {
              pcVar30 = JITTimeFunctionBody::GetDisplayName(pJVar12);
              bVar6 = false;
            }
          }
          pJVar12 = Func::GetJITFunctionBody(callInstr->m_func);
          PVar10 = JITTimeFunctionBody::GetPropertyIdFromCacheId
                             (pJVar12,this_01->m_inlineCacheIndex);
          pTVar4 = callInstr->m_func->m_threadContextInfo;
          pTVar28 = (ThreadContext *)pTVar4[-3].wellKnownHostTypeIds;
          if (pTVar4 == (ThreadContextInfo *)0x0) {
            pTVar28 = (ThreadContext *)0x0;
          }
          pPVar21 = ThreadContext::GetPropertyRecord(pTVar28,PVar10);
          pJVar12 = Func::GetJITFunctionBody(callInstr->m_func);
          pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
          pcVar14 = Func::GetDebugNumberSet(callInstr->m_func,(wchar (*) [42])local_d8);
          if (bVar6) {
            pcVar19 = L"(null)";
          }
          else {
            pcVar19 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeInfo,(wchar (*) [42])local_138);
          }
          pcVar29 = L"calling";
          if (isInlined) {
            pcVar29 = L"inlining";
          }
          pcVar27 = L"script";
          if (isBuiltIn) {
            pcVar27 = L"built-in";
          }
          pcVar25 = L"methods";
          if (isCtor) {
            pcVar25 = L"ctors";
          }
          Output::Print(L"FixedFields: function %s (#%u): %s non-fixed method %s (%s #%u) (cache id: %d), because %s fixed %s %s is disabled.\n"
                        ,pcVar13,pcVar14,local_58,pPVar21 + 1,pcVar30,pcVar19,
                        (ulong)this_01->m_inlineCacheIndex,pcVar29,pcVar27,pcVar25);
          goto LAB_00501f5f;
        }
        if (isBuiltIn) {
          if (isInlined) {
            PVar26 = FixedBuiltInMethodInliningPhase;
          }
          else {
            PVar26 = FixedBuiltInMethodCallsPhase;
          }
LAB_005016ac:
          bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,PVar26,uVar8,uVar9);
joined_r0x005016bc:
          if (bVar7) goto LAB_005016c2;
        }
        else {
          if (isInlined) {
            PVar26 = FixedScriptMethodInliningPhase;
            goto LAB_005016ac;
          }
          bVar7 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_01447bf0,FixedScriptMethodCallsPhase,uVar8,uVar9);
          if (!bVar7) goto LAB_005016c2;
        }
        if ((this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) &&
           (bVar7 = IR::PropertySymOpnd::IsRootObjectNonConfigurableFieldLoad(this_01), !bVar7)) {
          if (!bVar6) {
            return false;
          }
          pcVar30 = L"<unknown>";
          bVar6 = true;
          if (inlineeInfo == (FunctionJITTimeInfo *)0x0) {
            local_48 = L"calling";
          }
          else {
            bVar7 = FunctionJITTimeInfo::HasBody(inlineeInfo);
            local_48 = L"inlining";
            if ((bVar7) &&
               (pJVar12 = FunctionJITTimeInfo::GetBody(inlineeInfo),
               pJVar12 != (JITTimeFunctionBody *)0x0)) {
              pcVar30 = JITTimeFunctionBody::GetDisplayName(pJVar12);
              bVar6 = false;
            }
          }
          pJVar12 = Func::GetJITFunctionBody(callInstr->m_func);
          PVar10 = JITTimeFunctionBody::GetPropertyIdFromCacheId
                             (pJVar12,this_01->m_inlineCacheIndex);
          pTVar4 = callInstr->m_func->m_threadContextInfo;
          pTVar28 = (ThreadContext *)pTVar4[-3].wellKnownHostTypeIds;
          if (pTVar4 == (ThreadContextInfo *)0x0) {
            pTVar28 = (ThreadContext *)0x0;
          }
          pPVar21 = ThreadContext::GetPropertyRecord(pTVar28,PVar10);
          pJVar12 = Func::GetJITFunctionBody(callInstr->m_func);
          pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
          pcVar14 = Func::GetDebugNumberSet(callInstr->m_func,(wchar (*) [42])local_d8);
          if (bVar6) {
            pcVar19 = L"(null)";
          }
          else {
            pcVar19 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeInfo,(wchar (*) [42])local_138);
          }
          Output::Print(L"FixedFields: function %s (%s): %s non-fixed method %s (%s %s) (cache id: %d), because inline cache has no cached type.\n"
                        ,pcVar13,pcVar14,local_48,pPVar21 + 1,pcVar30,pcVar19,
                        (ulong)this_01->m_inlineCacheIndex);
          goto LAB_00501f5f;
        }
        if (isPolymorphic) {
          if ((!isInlined) || (bVar7 = IR::PropertySymOpnd::HasFixedValue(this_01), !bVar7))
          goto LAB_00501648;
          this_02 = IR::PropertySymOpnd::GetFixedFunction(this_01,i);
LAB_00501607:
          if (this_02 == (FixedFieldInfo *)0x0) goto LAB_00501648;
          if (inlineeInfo != (FunctionJITTimeInfo *)0x0) {
            iVar15 = FixedFieldInfo::GetFuncInfoAddr(this_02);
            iVar20 = FunctionJITTimeInfo::GetFunctionInfoAddr(inlineeInfo);
            if (iVar15 != iVar20 || dontOptimizeJustCheck) {
              return iVar15 == iVar20;
            }
LAB_00501ab5:
            if (pIVar22->m_opcode == LdMethodFromFlags) {
              if ((pIVar22->field_0x38 & 0x10) == 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar16 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                   ,0x736,"(ldMethodFldInstr->HasBailOutInfo())",
                                   "ldMethodFldInstr->HasBailOutInfo()");
                if (!bVar6) goto LAB_00502044;
                *puVar16 = 0;
              }
              IR::Instr::ClearBailOutInfo(pIVar22);
            }
            pIVar22->m_opcode = CheckFixedFld;
            dstOpnd = IR::Instr::UnlinkDst(pIVar22);
            bVar6 = IR::PropertySymOpnd::HasEquivalentTypeSet(this_01);
            pIVar22 = IR::Instr::ConvertToBailOutInstr
                                (pIVar22,pIVar22,(uint)bVar6 * 2 + BailOutFailedFixedFieldTypeCheck,
                                 0xffffffff);
            IVar3 = this_01->m_inlineCacheIndex;
            pBVar23 = IR::Instr::GetBailOutInfo(pIVar22);
            pBVar23->polymorphicCacheIndex = IVar3;
            bVar6 = IR::Opnd::IsSymOpnd(pIVar22->m_src1);
            if (!bVar6) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar16 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0x73f,"(chkMethodFldInstr->GetSrc1()->IsSymOpnd())",
                                 "chkMethodFldInstr->GetSrc1()->IsSymOpnd()");
              if (!bVar6) goto LAB_00502044;
              *puVar16 = 0;
            }
            this_03 = IR::Opnd::AsSymOpnd(pIVar22->m_src1);
            bVar6 = IR::SymOpnd::IsPropertySymOpnd(this_03);
            if (bVar6) {
              if (pIVar22->m_opcode != CheckFixedFld) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar16 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                   ,0x742,
                                   "(chkMethodFldInstr->m_opcode == Js::OpCode::CheckFixedFld)",
                                   "chkMethodFldInstr->m_opcode == Js::OpCode::CheckFixedFld");
                if (!bVar6) goto LAB_00502044;
                *puVar16 = 0;
              }
              this_04 = IR::Opnd::AsPropertySymOpnd(pIVar22->m_src1);
              bVar6 = IR::PropertySymOpnd::IsMono(this_04);
              if (((!bVar6) && (bVar6 = IR::PropertySymOpnd::IsLoadedFromProto(this_04), !bVar6)) &&
                 (bVar6 = IR::PropertySymOpnd::UsesAccessor(this_04), !bVar6)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar16 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                   ,0x745,
                                   "(chkMethodFldOpnd->IsMono() || chkMethodFldOpnd->IsLoadedFromProto() || chkMethodFldOpnd->UsesAccessor())"
                                   ,
                                   "chkMethodFldOpnd->IsMono() || chkMethodFldOpnd->IsLoadedFromProto() || chkMethodFldOpnd->UsesAccessor()"
                                  );
                if (!bVar6) goto LAB_00502044;
                *puVar16 = 0;
              }
              *(byte *)&this_04->field_12 = *(byte *)&this_04->field_12 | 2;
            }
            if (((isCtor) &&
                (this_05 = IR::PropertySymOpnd::GetCtorCache(this_01),
                this_05 != (JITTimeConstructorCache *)0x0)) &&
               ((callInstr->m_kind == InstrKindProfiled && (callInstr->m_opcode != NewScObjArray))))
            {
              bVar6 = JITTimeConstructorCache::IsUsed(this_05);
              if (bVar6) {
                this_05 = JITTimeConstructorCache::Clone(this_05,this->topFunc->m_alloc);
              }
              bVar6 = JITTimeConstructorCache::IsUsed(this_05);
              if (bVar6) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar16 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                   ,0x76e,"(!constructorCache->IsUsed())",
                                   "!constructorCache->IsUsed()");
                if (!bVar6) goto LAB_00502044;
                *puVar16 = 0;
              }
              JITTimeConstructorCache::SetUsed(this_05,true);
              this_00 = callInstr->m_func;
              pPVar24 = IR::Instr::AsProfiledInstr(callInstr);
              Func::SetConstructorCache(this_00,(pPVar24->u).field_3.fldInfoData.f1,this_05);
            }
            iVar15 = FixedFieldInfo::GetFieldValue(this_02);
            src1Opnd = IR::AddrOpnd::New(iVar15,AddrOpndKindDynamicVar,callInstr->m_func,false,
                                         (Var)0x0);
            src1Opnd->m_metadata = this_02;
            src1Opnd->field_0x28 = src1Opnd->field_0x28 | 2;
            instr = IR::Instr::New(Ld_A,dstOpnd,&src1Opnd->super_Opnd,callInstr->m_func);
            pRVar17 = IR::Opnd::AsRegOpnd(dstOpnd);
            pSVar18 = pRVar17->m_sym;
            if (((pSVar18->field_0x18 & 1) != 0) && ((pSVar18->field_5).m_instrDef != (Instr *)0x0))
            {
              StackSym::SetIsConst(pSVar18);
            }
            valueType = FixedFieldInfo::GetValueType(this_02);
            IR::Opnd::SetValueType(dstOpnd,valueType);
            IR::Instr::InsertAfter(pIVar22,instr);
            IR::Instr::ReplaceSrc1(callInstr,&src1Opnd->super_Opnd);
            if ((callInstr->m_opcode == CallI) ||
               (bVar6 = IR::Instr::CallsAccessor(callInstr,this_01), bVar6)) {
              callInstr->m_opcode = CallIFixed;
            }
            else if ((callInstr->m_opcode != NewScObject) && (callInstr->m_opcode != NewScObjArray))
            {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar16 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar16 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0x7a0,
                                 "(callInstr->m_opcode == Js::OpCode::NewScObject || callInstr->m_opcode == Js::OpCode::NewScObjArray)"
                                 ,
                                 "callInstr->m_opcode == Js::OpCode::NewScObject || callInstr->m_opcode == Js::OpCode::NewScObjArray"
                                );
              if (!bVar6) goto LAB_00502044;
              *puVar16 = 0;
            }
            if (!isInlined || isBuiltIn) {
              return true;
            }
            bVar6 = IR::PropertySymOpnd::IsRootObjectNonConfigurableField(this_01);
            if ((!bVar6) &&
               (TVar11 = IR::PropertySymOpnd::GetTypeId(this_01),
               0x3a < TVar11 - TypeIds_HostDispatch)) {
              return true;
            }
            *safeThis = true;
            return true;
          }
          bVar7 = Func::IsBuiltInInlinedInLowerer(callInstr->m_src1);
          if (!bVar7) {
            if (dontOptimizeJustCheck) {
              return true;
            }
            goto LAB_00501ab5;
          }
          if (!bVar6) {
            return false;
          }
          pJVar12 = Func::GetJITFunctionBody(callInstr->m_func);
          PVar10 = JITTimeFunctionBody::GetPropertyIdFromCacheId
                             (pJVar12,this_01->m_inlineCacheIndex);
          pTVar4 = callInstr->m_func->m_threadContextInfo;
          pTVar28 = (ThreadContext *)pTVar4[-3].wellKnownHostTypeIds;
          if (pTVar4 == (ThreadContextInfo *)0x0) {
            pTVar28 = (ThreadContext *)0x0;
          }
          pPVar21 = ThreadContext::GetPropertyRecord(pTVar28,PVar10);
          pJVar12 = Func::GetJITFunctionBody(callInstr->m_func);
          pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
          pcVar14 = Func::GetDebugNumberSet(callInstr->m_func,(wchar (*) [42])local_d8);
          uVar2 = this_01->m_inlineCacheIndex;
          bVar6 = IR::PropertySymOpnd::IsLoadedFromProto(this_01);
          if (bVar6) {
            pcVar29 = L"proto";
          }
          else {
            bVar6 = IR::PropertySymOpnd::UsesAccessor(this_01);
            pcVar29 = L"local";
            if (bVar6) {
              pcVar29 = L"accessor";
            }
          }
          pcVar27 = 
          L"FixedFields: function %s (%s): %s non-fixed method %s (%s %s) (cache id: %d, layout: %s), because callee is a built-in with fast path in lowerer.\n"
          ;
          local_48 = L"calling";
          pcVar30 = L"<unknown>";
          pcVar19 = L"(null)";
        }
        else {
          bVar7 = IR::PropertySymOpnd::HasFixedValue(this_01);
          if (bVar7) {
            this_02 = IR::PropertySymOpnd::GetFixedFunction(this_01);
            goto LAB_00501607;
          }
LAB_00501648:
          if (!bVar6) {
            return false;
          }
          pcVar30 = L"<unknown>";
          bVar6 = true;
          if (inlineeInfo == (FunctionJITTimeInfo *)0x0) {
            local_48 = L"calling";
          }
          else {
            bVar7 = FunctionJITTimeInfo::HasBody(inlineeInfo);
            local_48 = L"inlining";
            if ((bVar7) &&
               (pJVar12 = FunctionJITTimeInfo::GetBody(inlineeInfo),
               pJVar12 != (JITTimeFunctionBody *)0x0)) {
              pcVar30 = JITTimeFunctionBody::GetDisplayName(pJVar12);
              bVar6 = false;
            }
          }
          pJVar12 = Func::GetJITFunctionBody(callInstr->m_func);
          PVar10 = JITTimeFunctionBody::GetPropertyIdFromCacheId
                             (pJVar12,this_01->m_inlineCacheIndex);
          pTVar4 = callInstr->m_func->m_threadContextInfo;
          pTVar28 = (ThreadContext *)pTVar4[-3].wellKnownHostTypeIds;
          if (pTVar4 == (ThreadContextInfo *)0x0) {
            pTVar28 = (ThreadContext *)0x0;
          }
          pPVar21 = ThreadContext::GetPropertyRecord(pTVar28,PVar10);
          pJVar12 = Func::GetJITFunctionBody(callInstr->m_func);
          pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
          pcVar14 = Func::GetDebugNumberSet(callInstr->m_func,(wchar (*) [42])local_d8);
          if (bVar6) {
            pcVar19 = L"(null)";
          }
          else {
            pcVar19 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeInfo,(wchar (*) [42])local_138);
          }
          uVar2 = this_01->m_inlineCacheIndex;
          bVar6 = IR::PropertySymOpnd::IsLoadedFromProto(this_01);
          if (bVar6) {
            pcVar29 = L"proto";
          }
          else {
            bVar6 = IR::PropertySymOpnd::UsesAccessor(this_01);
            pcVar29 = L"local";
            if (bVar6) {
              pcVar29 = L"accessor";
            }
          }
          pcVar27 = 
          L"FixedFields: function %s (%s): %s non-fixed method %s (%s %s) (cache id: %d, layout: %s), because inline cache has no fixed function object.\n"
          ;
        }
        Output::Print(pcVar27,pcVar13,pcVar14,local_48,pPVar21 + 1,pcVar30,pcVar19,(ulong)uVar2,
                      pcVar29);
        goto LAB_00501f5f;
      }
      pSVar18 = IR::Opnd::GetStackSym(pIVar22->m_src1);
    } while (((pSVar18->field_0x18 & 1) != 0) &&
            (pIVar22 = (pSVar18->field_5).m_instrDef, pIVar22 != (Instr *)0x0));
  }
  if (!bVar6) {
    return false;
  }
  pcVar30 = L"<unknown>";
  bVar6 = true;
  if (inlineeInfo == (FunctionJITTimeInfo *)0x0) {
    pcVar29 = L"calling";
  }
  else {
    bVar7 = FunctionJITTimeInfo::HasBody(inlineeInfo);
    pcVar29 = L"inlining";
    if ((bVar7) &&
       (pJVar12 = FunctionJITTimeInfo::GetBody(inlineeInfo), pJVar12 != (JITTimeFunctionBody *)0x0))
    {
      pcVar30 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      bVar6 = false;
    }
  }
  pJVar12 = Func::GetJITFunctionBody(callInstr->m_func);
  pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
  pcVar14 = Func::GetDebugNumberSet(callInstr->m_func,(wchar (*) [42])local_d8);
  if (bVar6) {
    pcVar19 = L"(null)";
  }
  else {
    pcVar19 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeInfo,(wchar (*) [42])local_138);
  }
  pcVar27 = 
  L"FixedFields: function %s (%s): %s non-fixed method (%s %s), because callee is not single def.\n"
  ;
LAB_00501549:
  Output::Print(pcVar27,pcVar13,pcVar14,pcVar29,pcVar30,pcVar19);
LAB_00501f5f:
  Output::Flush();
  return false;
}

Assistant:

bool
Inline::TryOptimizeCallInstrWithFixedMethod(IR::Instr *callInstr, const FunctionJITTimeInfo * inlineeInfo, bool isPolymorphic, bool isBuiltIn, bool isCtor, bool isInlined, bool &safeThis,
                                            bool dontOptimizeJustCheck, uint i /*i-th inlinee at a polymorphic call site*/)
{
    if (PHASE_OFF(Js::FixedMethodsPhase, callInstr->m_func))
    {
        return false;
    }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
#define TRACE_FIXED_FIELDS 1
#endif

#if TRACE_FIXED_FIELDS
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    bool printFixedFieldsTrace =
        (
            PHASE_TRACE(Js::FixedMethodsPhase, callInstr->m_func) ||
            PHASE_TESTTRACE(Js::FixedMethodsPhase, callInstr->m_func) ||
            (isCtor && (
                PHASE_TRACE(Js::FixedNewObjPhase, callInstr->m_func) ||
                PHASE_TESTTRACE(Js::FixedNewObjPhase, callInstr->m_func)))
        ) && !dontOptimizeJustCheck && !JITManager::GetJITManager()->IsJITServer();

    if (printFixedFieldsTrace)
    {
        JITTimeFunctionBody * calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
        const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

        Output::Print(_u("FixedFields: function %s (%s): considering method (%s %s): polymorphic = %d, built-in = %d, ctor = %d, inlined = %d, functionInfo = %p.\n"),
            callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer), calleeName,
            calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"),
            isPolymorphic, isBuiltIn, isCtor, isInlined, inlineeInfo ? inlineeInfo->GetFunctionInfoAddr() : 0);
        Output::Flush();
    }
#endif

    if (isPolymorphic && isInlined)
    {
        Assert(dontOptimizeJustCheck);
    }

    StackSym* methodValueSym = callInstr->GetSrc1()->AsRegOpnd()->m_sym->AsStackSym();
    if (!methodValueSym->IsSingleDef())
    {
#if TRACE_FIXED_FIELDS
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

            Output::Print(_u("FixedFields: function %s (%s): %s non-fixed method (%s %s), because callee is not single def.\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"), calleeName,
                calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"));
            Output::Flush();
        }
#endif
        return false;
    }

    IR::Instr* ldMethodFldInstr = methodValueSym->GetInstrDef();
    while (ldMethodFldInstr->m_opcode == Js::OpCode::BytecodeArgOutCapture)
    {
        StackSym* sym = ldMethodFldInstr->GetSrc1()->GetStackSym();
        if (!sym->IsSingleDef())
        {
#if TRACE_FIXED_FIELDS
            if (printFixedFieldsTrace)
            {
                JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
                const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

                Output::Print(_u("FixedFields: function %s (%s): %s non-fixed method (%s %s), because callee is not single def.\n"),
                    callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                    inlineeInfo != nullptr ? _u("inlining") : _u("calling"), calleeName,
                    calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"));
                Output::Flush();
            }
#endif
            return false;
        }
        ldMethodFldInstr = sym->GetInstrDef();
    }
    if (ldMethodFldInstr->m_opcode != Js::OpCode::ScopedLdMethodFld
        && ldMethodFldInstr->m_opcode != Js::OpCode::LdRootMethodFld
        && ldMethodFldInstr->m_opcode != Js::OpCode::LdMethodFld
        && ldMethodFldInstr->m_opcode != Js::OpCode::LdRootFld
        && ldMethodFldInstr->m_opcode != Js::OpCode::LdFld
        && ldMethodFldInstr->m_opcode != Js::OpCode::LdFldForCallApplyTarget
        && ldMethodFldInstr->m_opcode != Js::OpCode::LdMethodFromFlags)
    {
#if TRACE_FIXED_FIELDS
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

            Output::Print(_u("FixedFields: function %s (%s): %s non-fixed method (%s %s), because callee does not come from LdMethodFld.\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"), calleeName,
                calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"));
            Output::Flush();
        }
#endif
        return false;
    }

    IR::PropertySymOpnd* methodPropertyOpnd = ldMethodFldInstr->GetSrc1()->AsPropertySymOpnd();

    if ((isCtor &&
            ((isInlined && PHASE_OFF(Js::FixedCtorInliningPhase, callInstr->m_func)) ||
            (!isInlined && PHASE_OFF(Js::FixedCtorCallsPhase, callInstr->m_func)) ||
            (methodPropertyOpnd->UsesAccessor()))) ||
        (!isCtor &&
            ((isBuiltIn &&
                ((isInlined && PHASE_OFF(Js::FixedBuiltInMethodInliningPhase, callInstr->m_func)) ||
                (!isInlined && PHASE_OFF(Js::FixedBuiltInMethodCallsPhase, callInstr->m_func)))) ||
            (!isBuiltIn &&
                ((isInlined && PHASE_OFF(Js::FixedScriptMethodInliningPhase, callInstr->m_func)) ||
                (!isInlined && !PHASE_ON(Js::FixedScriptMethodCallsPhase, callInstr->m_func))))))
       )
    {
#if TRACE_FIXED_FIELDS
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

            Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
            Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetInProcThreadContext()->GetPropertyRecord(methodPropertyId);

            Output::Print(_u("FixedFields: function %s (#%u): %s non-fixed method %s (%s #%u) (cache id: %d), because %s fixed %s %s is disabled.\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"), methodPropertyRecord->GetBuffer(), calleeName,
                calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"),
                methodPropertyOpnd->m_inlineCacheIndex, isInlined ? _u("inlining") : _u("calling"), isBuiltIn ? _u("built-in") : _u("script"),
                isCtor ? _u("ctors") : _u("methods"));
            Output::Flush();
        }
#endif
        return false;
    }

    if (!methodPropertyOpnd->IsObjTypeSpecCandidate() && !methodPropertyOpnd->IsRootObjectNonConfigurableFieldLoad())
    {
#if TRACE_FIXED_FIELDS
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");
            Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
            Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetInProcThreadContext()->GetPropertyRecord(methodPropertyId);

            Output::Print(_u("FixedFields: function %s (%s): %s non-fixed method %s (%s %s) (cache id: %d), because inline cache has no cached type.\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"), methodPropertyRecord->GetBuffer(), calleeName,
                calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"),
                methodPropertyOpnd->m_inlineCacheIndex);
            Output::Flush();
        }
#endif
        return false;
    }

    FixedFieldInfo * fixedField = nullptr;
    if (!isPolymorphic)
    {
        fixedField = methodPropertyOpnd->HasFixedValue() ? methodPropertyOpnd->GetFixedFunction() : nullptr;
    }
    else if (isPolymorphic && isInlined)
    {
        fixedField = methodPropertyOpnd->HasFixedValue() ? methodPropertyOpnd->GetFixedFunction(i) : nullptr;
    }

    if (!fixedField)
    {
#if TRACE_FIXED_FIELDS
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

            Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
            Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetInProcThreadContext()->GetPropertyRecord(methodPropertyId);

            Output::Print(_u("FixedFields: function %s (%s): %s non-fixed method %s (%s %s) (cache id: %d, layout: %s), because inline cache has no fixed function object.\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"), methodPropertyRecord->GetBuffer(), calleeName,
                calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"),
                methodPropertyOpnd->m_inlineCacheIndex,
                methodPropertyOpnd->IsLoadedFromProto() ? _u("proto") : methodPropertyOpnd->UsesAccessor() ? _u("accessor") : _u("local"));
            Output::Flush();
        }
#endif
        return false;
    }

    // Certain built-ins that we decide not to inline will get a fast path emitted by the lowerer.
    // The lowering code cannot handle a call with a fixed function target, because it needs access to
    // the original property sym. Turn off fixed method calls for these cases.
    if (inlineeInfo == nullptr && Func::IsBuiltInInlinedInLowerer(callInstr->GetSrc1()))
    {
#if TRACE_FIXED_FIELDS
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

            Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
            Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetInProcThreadContext()->GetPropertyRecord(methodPropertyId);

            Output::Print(_u("FixedFields: function %s (%s): %s non-fixed method %s (%s %s) (cache id: %d, layout: %s), because callee is a built-in with fast path in lowerer.\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"), methodPropertyRecord->GetBuffer(), calleeName,
                calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"),
                methodPropertyOpnd->m_inlineCacheIndex,
                methodPropertyOpnd->IsLoadedFromProto() ? _u("proto") : methodPropertyOpnd->UsesAccessor() ? _u("accessor") : _u("local"));
            Output::Flush();
        }
#endif
        return false;
    }

    if (inlineeInfo != nullptr && fixedField->GetFuncInfoAddr() != inlineeInfo->GetFunctionInfoAddr())
    {
#if TRACE_FIXED_FIELDS && 0// TODO: OOP JIT, trace fixed fields
        if (printFixedFieldsTrace)
        {
            char16 debugStringBuffer3[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
            Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetInProcThreadContext()->GetPropertyRecord(methodPropertyId);
            bool isProto = methodPropertyOpnd->IsLoadedFromProto();
            bool isAccessor = methodPropertyOpnd->UsesAccessor();
            Js::FunctionBody* fixedFunctionBody   = functionObject->GetFunctionInfo()->GetFunctionBody();
            const char16* fixedFunctionNumbers   = fixedFunctionBody ? fixedFunctionBody->GetDebugNumberSet(debugStringBuffer2) : _u("(null)");
            JITTimeFunctionBody* profileFunctionBody = inlineeInfo->GetBody();
            const char16* profileFunctionName    = profileFunctionBody != nullptr ? profileFunctionBody->GetDisplayName() : _u("<unknown>");
            const char16* profileFunctionNumbers = profileFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer3) : _u("(null)");

            if (PHASE_TRACE(Js::FixedMethodsPhase, callInstr->m_func))
            {
                intptr_t protoObject = isProto ? methodPropertyOpnd->GetProtoObject() : 0;
                Output::Print(_u("FixedFields: function %s (#%s): function body mismatch for inlinee: %s (%s) 0x%p->0x%p != %s (%s) 0x%p (cache id: %d, layout: %s, type: 0x%p, proto: 0x%p, proto type: 0x%p).\n"),
                    callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                    methodPropertyRecord->GetBuffer(), fixedFunctionNumbers, functionObject, functionObject->GetFunctionInfo(),
                    profileFunctionName, profileFunctionNumbers, inlineeInfo->GetFunctionInfoAddr(),
                    methodPropertyOpnd->m_inlineCacheIndex, isProto ? _u("proto") : isAccessor ? _u("accessor") : _u("local"),
                    methodPropertyOpnd->GetType(), protoObject, protoObject != nullptr ? protoObject->GetType() : nullptr);
            }
            if (PHASE_TESTTRACE(Js::FixedMethodsPhase, callInstr->m_func))
            {
                Output::Print(_u("FixedFields: function %s (%s): function body mismatch for inlinee: %s (%s) != %s (%s) (cache id: %d, layout: %s).\n"),
                    callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                    methodPropertyRecord->GetBuffer(), fixedFunctionNumbers, profileFunctionName, profileFunctionNumbers,
                    methodPropertyOpnd->m_inlineCacheIndex, isProto ? _u("proto") : isAccessor ? _u("accessor") : _u("local"));
            }
            Output::Flush();
        }
#endif
        // It appears that under certain bailout and re-JIT conditions we may end up with an updated
        // inline cache pointing to a new function object, while the call site profile info still
        // holds the old function body.  If the two don't match, let's fall back on the regular LdMethodFld.
        return false;
    }
    else
    {
#if TRACE_FIXED_FIELDS && 0// TODO: OOP JIT, trace fixed fields
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
            Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetInProcThreadContext()->GetPropertyRecord(methodPropertyId);
            const char16* fixedFunctionName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");
            Js::FunctionBody* fixedFunctionBody = functionObject->GetFunctionInfo()->GetFunctionBody();
            const char16* fixedFunctionNumbers = fixedFunctionBody ? fixedFunctionBody->GetDebugNumberSet(debugStringBuffer2) : _u("(null)");

            Output::Print(_u("FixedFields: function %s (%s): %s fixed method %s (%s %s) (cache id: %d, layout: %s).\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"),
                methodPropertyRecord->GetBuffer(), fixedFunctionName, fixedFunctionNumbers,
                methodPropertyOpnd->m_inlineCacheIndex,
                methodPropertyOpnd->IsLoadedFromProto() ? _u("proto") : methodPropertyOpnd->UsesAccessor() ? _u("accessor") : _u("local"));
            Output::Flush();
        }
#endif
    }

#undef TRACE_FIXED_FIELDS

    if (dontOptimizeJustCheck)
    {
        return true;
    }

    // Change Ld[Root]MethodFld, LdMethodFromFlags to CheckFixedFld, which doesn't need a dst.
    if(ldMethodFldInstr->m_opcode == Js::OpCode::LdMethodFromFlags)
    {
        Assert(ldMethodFldInstr->HasBailOutInfo());
        ldMethodFldInstr->ClearBailOutInfo();
    }
    ldMethodFldInstr->m_opcode = Js::OpCode::CheckFixedFld;
    IR::Opnd * methodValueDstOpnd = ldMethodFldInstr->UnlinkDst();
    IR::Instr * chkMethodFldInstr = ldMethodFldInstr->ConvertToBailOutInstr(ldMethodFldInstr,
        !methodPropertyOpnd->HasEquivalentTypeSet() ? IR::BailOutFailedFixedFieldTypeCheck : IR::BailOutFailedEquivalentFixedFieldTypeCheck);
    chkMethodFldInstr->GetBailOutInfo()->polymorphicCacheIndex = methodPropertyOpnd->m_inlineCacheIndex;

    Assert(chkMethodFldInstr->GetSrc1()->IsSymOpnd());
    if (chkMethodFldInstr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
    {
        Assert(chkMethodFldInstr->m_opcode == Js::OpCode::CheckFixedFld);
        IR::PropertySymOpnd* chkMethodFldOpnd = chkMethodFldInstr->GetSrc1()->AsPropertySymOpnd();
        // For polymorphic field loads we only support fixed functions on prototypes. This helps keep the equivalence check helper simple.
        Assert(chkMethodFldOpnd->IsMono() || chkMethodFldOpnd->IsLoadedFromProto() || chkMethodFldOpnd->UsesAccessor());
        chkMethodFldOpnd->SetUsesFixedValue(true);
    }

    if (isCtor)
    {
        JITTimeConstructorCache* constructorCache = methodPropertyOpnd->GetCtorCache();
        if (constructorCache != nullptr && callInstr->IsProfiledInstr())
        {

#if ENABLE_DEBUG_CONFIG_OPTIONS && 0// TODO: OOP JIT, trace fixed fields
            if (PHASE_TRACE(Js::FixedNewObjPhase, callInstr->m_func) || PHASE_TESTTRACE(Js::FixedNewObjPhase, callInstr->m_func))
            {
                JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
                Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
                Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetThreadContextInfo()->GetPropertyRecord(methodPropertyId);
                const char16* fixedFunctionName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");
                Js::FunctionBody* fixedFunctionBody = functionObject->GetFunctionInfo()->GetFunctionBody();
                const char16* fixedFunctionNumbers = fixedFunctionBody ? fixedFunctionBody->GetDebugNumberSet(debugStringBuffer2) : _u("(null)");

                Output::Print(_u("FixedNewObj: function %s (%s): fixed new object for %s with %s ctor %s (%s %s)%s\n"),
                    callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer), Js::OpCodeUtil::GetOpCodeName(callInstr->m_opcode),
                    inlineeInfo != nullptr ? _u("inlined") : _u("called"),
                    methodPropertyRecord->GetBuffer(), fixedFunctionName, fixedFunctionNumbers,
                    constructorCache->SkipNewScObject() ? _u(" skip default object") : _u(""));
                Output::Flush();
            }
#endif

            // The profile ID's hung from array ctor opcodes don't match up with normal profiled call sites.
            if (callInstr->m_opcode != Js::OpCode::NewScObjArray)
            {
                // Because we are storing flow sensitive info in the cache (guarded property operations),
                // we must make sure the same cache cannot be used multiple times in the flow.
                if (constructorCache->IsUsed())
                {
                    // It's okay to allocate a JitTimeConstructorCache from the func's allocator (rather than recycler),
                    // because we only use these during JIT. We use the underlying runtime cache as a guard that must
                    // live after JIT, and these are added to the EntryPointInfo during work item creation and thus kept alive.
                    constructorCache = constructorCache->Clone(this->topFunc->m_alloc);
                }
                Assert(!constructorCache->IsUsed());
                constructorCache->SetUsed(true);
                callInstr->m_func->SetConstructorCache(static_cast<Js::ProfileId>(callInstr->AsProfiledInstr()->u.profileId), constructorCache);
            }
        }
        else
        {
#if ENABLE_DEBUG_CONFIG_OPTIONS && 0// TODO: OOP JIT, trace fixed fields
            if (PHASE_TRACE(Js::FixedNewObjPhase, callInstr->m_func) || PHASE_TESTTRACE(Js::FixedNewObjPhase, callInstr->m_func))
            {
                JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
                Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
                Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetThreadContextInfo()->GetPropertyRecord(methodPropertyId);
                const char16* fixedFunctionName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");
                Js::FunctionBody* fixedFunctionBody = functionObject->GetFunctionInfo()->GetFunctionBody();
                const char16* fixedFunctionNumbers = fixedFunctionBody ? fixedFunctionBody->GetDebugNumberSet(debugStringBuffer2) : _u("(null)");

                Output::Print(_u("FixedNewObj: function %s (%s): non-fixed new object for %s with %s ctor %s (%s %s), because %s.\n"),
                    callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer), Js::OpCodeUtil::GetOpCodeName(callInstr->m_opcode),
                    inlineeInfo != nullptr ? _u("inlined") : _u("called"),
                    methodPropertyRecord->GetBuffer(), fixedFunctionName, fixedFunctionNumbers,
                    constructorCache == nullptr ? _u("constructor cache hasn't been cloned") : _u("instruction isn't profiled"));
                Output::Flush();
            }
#endif
        }
    }

    // Insert a load instruction to place the constant address in methodOpnd (the Ld[Root]MethodFld's original dst).
    IR::AddrOpnd * constMethodValueOpnd = IR::AddrOpnd::New(fixedField->GetFieldValue(), IR::AddrOpndKind::AddrOpndKindDynamicVar, callInstr->m_func);
    constMethodValueOpnd->m_metadata = fixedField;
    constMethodValueOpnd->m_isFunction = true;
    IR::Instr * ldMethodValueInstr = IR::Instr::New(Js::OpCode::Ld_A, methodValueDstOpnd, constMethodValueOpnd, callInstr->m_func);
    StackSym* methodSym = methodValueDstOpnd->AsRegOpnd()->m_sym;
    if (methodSym->IsSingleDef())
    {
        methodSym->SetIsConst();
    }
    methodValueDstOpnd->SetValueType(fixedField->GetValueType());
    chkMethodFldInstr->InsertAfter(ldMethodValueInstr);
    callInstr->ReplaceSrc1(constMethodValueOpnd);
    if (callInstr->m_opcode == Js::OpCode::CallI || callInstr->CallsAccessor(methodPropertyOpnd))
    {
        callInstr->m_opcode = Js::OpCode::CallIFixed;
    }
    else
    {
        // We patch later for constructor inlining.
        AssertOrFailFast(
            callInstr->m_opcode == Js::OpCode::NewScObject ||
            callInstr->m_opcode == Js::OpCode::NewScObjArray);
    }

    if (!isBuiltIn && isInlined)
    {
        // We eliminate CheckThis for fixed method inlining. Assert here that our assumption is true.
        Js::TypeId typeId = methodPropertyOpnd->IsRootObjectNonConfigurableField() ?
            Js::TypeIds_GlobalObject : methodPropertyOpnd->GetTypeId();
        if(typeId > Js::TypeIds_LastJavascriptPrimitiveType && typeId <= Js::TypeIds_LastTrueJavascriptObjectType)
        {
            // Eliminate CheckThis for inlining.
            safeThis = true;
        }
    }
    return true;
}